

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws-cache-ttl.c
# Opt level: O3

void lws_cache_destroy(lws_cache_ttl_lru **_cache)

{
  lws_cache_ttl_lru *plVar1;
  
  plVar1 = *_cache;
  if (plVar1 == (lws_cache_ttl_lru *)0x0) {
    return;
  }
  if (((plVar1->info).ops)->destroy != (_func_void_lws_cache_ttl_lru_ptr_ptr *)0x0) {
    lws_sul_cancel(&plVar1->sul);
    (*((plVar1->info).ops)->destroy)(_cache);
    return;
  }
  __assert_fail("cache->info.ops->destroy",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/misc/cache-ttl/lws-cache-ttl.c"
                ,0x127,"void lws_cache_destroy(struct lws_cache_ttl_lru **)");
}

Assistant:

void
lws_cache_destroy(struct lws_cache_ttl_lru **_cache)
{
	lws_cache_ttl_lru_t *cache = *_cache;

	if (!cache)
		return;

	assert(cache->info.ops->destroy);

	lws_sul_cancel(&cache->sul);

	cache->info.ops->destroy(_cache);
}